

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManSimulateRound(Gia_ManSim_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint *__s;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  
  pGVar3 = p->pAig;
  if (pGVar3->nFront < 1) {
    __assert_fail("p->pAig->nFront > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1df,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  pGVar4 = pGVar3->pObjs;
  if (pGVar4->Value != 0) {
    __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1e0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  __s = p->pDataSim;
  if (0 < (long)p->nWords) {
    memset(__s,0,(long)p->nWords << 2);
  }
  iVar12 = 0;
  iVar8 = 0;
  if (1 < pGVar3->nObjs) {
    iVar8 = 0;
    lVar9 = 1;
    iVar12 = 0;
    do {
      pGVar1 = pGVar4 + lVar9;
      uVar5 = *(ulong *)pGVar1;
      uVar15 = (uint)uVar5;
      iVar7 = iVar12;
      if ((int)uVar15 < 0) {
        uVar2 = pGVar1->Value;
        if ((~uVar15 & 0x1fffffff) == 0) {
          if (pGVar3->nFront <= (int)uVar2) {
            __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                          ,0x1f0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
          }
          iVar13 = p->nWords;
          iVar7 = iVar12 + 1;
          if (0 < (long)iVar13) {
            puVar6 = p->pDataSimCis;
            lVar11 = (long)iVar13 + 1;
            do {
              __s[(long)(int)(uVar2 * iVar13) + lVar11 + -2] =
                   puVar6[(long)(iVar12 * iVar13) + lVar11 + -2];
              lVar11 = lVar11 + -1;
            } while (1 < lVar11);
          }
        }
        else {
          if (uVar2 != 0x1fffffff) {
            __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                          ,0x1eb,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
          }
          uVar2 = p->nWords;
          iVar12 = uVar2 * iVar8;
          iVar8 = iVar8 + 1;
          iVar13 = (uVar15 & 0x1fffffff) * uVar2;
          puVar6 = p->pDataSimCos;
          if ((uVar15 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar2) {
              lVar11 = (ulong)uVar2 + 1;
              do {
                puVar6[(long)iVar12 + lVar11 + -2] = __s[(long)iVar13 + lVar11 + -2];
                lVar11 = lVar11 + -1;
              } while (1 < lVar11);
            }
          }
          else if (0 < (int)uVar2) {
            lVar11 = (ulong)uVar2 + 1;
            do {
              puVar6[(long)iVar12 + lVar11 + -2] = ~__s[(long)iVar13 + lVar11 + -2];
              lVar11 = lVar11 + -1;
            } while (1 < lVar11);
          }
        }
      }
      else {
        if (pGVar3->nFront <= (int)pGVar1->Value) {
          __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                        ,0x1e6,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
        }
        uVar2 = p->nWords;
        uVar10 = (ulong)uVar2;
        iVar12 = pGVar1->Value * uVar2;
        iVar13 = (uVar15 & 0x1fffffff) * uVar2;
        iVar14 = ((uint)(uVar5 >> 0x20) & 0x1fffffff) * uVar2;
        if ((uVar15 >> 0x1d & 1) == 0) {
          if ((uVar5 >> 0x3d & 1) == 0) {
            if (0 < (int)uVar2) {
              lVar11 = uVar10 + 1;
              do {
                __s[(long)iVar12 + lVar11 + -2] =
                     __s[(long)iVar14 + lVar11 + -2] & __s[(long)iVar13 + lVar11 + -2];
                lVar11 = lVar11 + -1;
              } while (1 < lVar11);
            }
          }
          else if (0 < (int)uVar2) {
            lVar11 = uVar10 + 1;
            do {
              __s[(long)iVar12 + lVar11 + -2] =
                   ~__s[(long)iVar14 + lVar11 + -2] & __s[(long)iVar13 + lVar11 + -2];
              lVar11 = lVar11 + -1;
            } while (1 < lVar11);
          }
        }
        else if ((uVar5 >> 0x3d & 1) == 0) {
          if (0 < (int)uVar2) {
            lVar11 = uVar10 + 1;
            do {
              __s[(long)iVar12 + lVar11 + -2] =
                   ~__s[(long)iVar13 + lVar11 + -2] & __s[(long)iVar14 + lVar11 + -2];
              lVar11 = lVar11 + -1;
            } while (1 < lVar11);
          }
        }
        else if (0 < (int)uVar2) {
          lVar11 = uVar10 + 1;
          do {
            __s[(long)iVar12 + lVar11 + -2] =
                 ~(__s[(long)iVar14 + lVar11 + -2] | __s[(long)iVar13 + lVar11 + -2]);
            lVar11 = lVar11 + -1;
          } while (1 < lVar11);
        }
      }
      iVar12 = iVar7;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pGVar3->nObjs);
  }
  if (pGVar3->vCis->nSize != iVar12) {
    __assert_fail("Gia_ManCiNum(p->pAig) == iCis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,500,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  if (pGVar3->vCos->nSize != iVar8) {
    __assert_fail("Gia_ManCoNum(p->pAig) == iCos",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1f5,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  return;
}

Assistant:

void Gia_ManSimulateRound( Gia_ManSim_t * p )
{
    Gia_Obj_t * pObj;
    int i, iCis = 0, iCos = 0;
    assert( p->pAig->nFront > 0 );
    assert( Gia_ManConst0(p->pAig)->Value == 0 );
    Gia_ManSimInfoZero( p, Gia_SimData(p, 0) );
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAndOrConst0(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateNode( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == GIA_NONE );
            Gia_ManSimulateCo( p, iCos++, pObj );
        }
        else // if ( Gia_ObjIsCi(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateCi( p, pObj, iCis++ );
        }
    }
    assert( Gia_ManCiNum(p->pAig) == iCis );
    assert( Gia_ManCoNum(p->pAig) == iCos );
}